

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution3d.cpp
# Opt level: O0

void __thiscall ncnn::Deconvolution3D::Deconvolution3D(Deconvolution3D *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffff70;
  
  Layer::Layer(in_stack_ffffffffffffff70);
  *in_RDI = &PTR__Deconvolution3D_0201fe30;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  in_RDI[0x2b] = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)((long)in_RDI + 0x164) = 0;
  *(undefined4 *)(in_RDI + 0x2d) = 0;
  *(undefined4 *)((long)in_RDI + 0x16c) = 0;
  *(undefined4 *)(in_RDI + 0x2e) = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  in_RDI[0x32] = 0;
  *(undefined4 *)(in_RDI + 0x33) = 0;
  in_RDI[0x34] = 0;
  *(undefined4 *)(in_RDI + 0x35) = 0;
  *(undefined4 *)((long)in_RDI + 0x1ac) = 0;
  *(undefined4 *)(in_RDI + 0x36) = 0;
  *(undefined4 *)((long)in_RDI + 0x1b4) = 0;
  *(undefined4 *)(in_RDI + 0x37) = 0;
  in_RDI[0x38] = 0;
  in_RDI[0x39] = 0;
  in_RDI[0x3a] = 0;
  in_RDI[0x3b] = 0;
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  in_RDI[0x3d] = 0;
  *(undefined4 *)(in_RDI + 0x3e) = 0;
  *(undefined4 *)((long)in_RDI + 500) = 0;
  *(undefined4 *)(in_RDI + 0x3f) = 0;
  *(undefined4 *)((long)in_RDI + 0x1fc) = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  in_RDI[0x41] = 0;
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

Deconvolution3D::Deconvolution3D()
{
    one_blob_only = true;
    support_inplace = false;
}